

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_tree.h
# Opt level: O2

pair<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_bool>
 __thiscall
Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::
insert_simplex_raw<std::initializer_list<int>>
          (Simplex_tree<Gudhi::Simplex_tree_options_default> *this,initializer_list<int> *simplex,
          Filtration_value *filtration)

{
  uint uVar1;
  uint *puVar2;
  undefined8 *puVar3;
  uint uVar4;
  initializer_list<int> *piVar5;
  ulong uVar6;
  uint *puVar7;
  pair<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_false>,_bool>
  pVar8;
  pair<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_bool>
  pVar9;
  __buckets_ptr local_40;
  char local_38;
  
  piVar5 = simplex + 4;
  puVar2 = (uint *)*filtration;
  puVar7 = puVar2;
  while( true ) {
    uVar4 = *puVar7;
    uVar1 = (uint)simplex[3]._M_len;
    if (puVar7 == puVar2 + (long)filtration[1] + -1) break;
    if (uVar4 == uVar1) goto LAB_00109951;
    insert_node_<false,true,false,double_const&>
              ((Simplex_tree<Gudhi::Simplex_tree_options_default> *)&stack0xffffffffffffffc0,
               (Siblings *)simplex,(Vertex_handle)piVar5,(double *)(ulong)uVar4);
    piVar5 = (initializer_list<int> *)local_40[3];
    puVar7 = puVar7 + 1;
    puVar2 = (uint *)*filtration;
  }
  if (uVar4 != uVar1) {
    pVar8 = insert_node_<true,false,true,double_const&>
                      ((Simplex_tree<Gudhi::Simplex_tree_options_default> *)&stack0xffffffffffffffc0
                       ,(Siblings *)simplex,(Vertex_handle)piVar5,(double *)(ulong)uVar4);
    uVar6 = pVar8._8_8_;
    if (local_38 == '\x01') {
      uVar4 = *(int *)(filtration + 1) - 1;
      uVar6 = (ulong)uVar4;
      if (*(int *)&simplex[8]._M_array < (int)uVar4) {
        *(uint *)&simplex[8]._M_array = uVar4;
      }
    }
    (this->nodes_label_to_list_)._M_h._M_buckets = local_40;
    *(char *)&(this->nodes_label_to_list_)._M_h._M_bucket_count = local_38;
    pVar9._8_8_ = uVar6;
    pVar9.first.m_ptr =
         (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>
          *)this;
    return pVar9;
  }
LAB_00109951:
  puVar3 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar3 = "cannot use the dummy null_vertex() as a real vertex";
  __cxa_throw(puVar3,&char_const*::typeinfo,0);
}

Assistant:

std::pair<Simplex_handle, bool> insert_simplex_raw(const RandomVertexHandleRange& simplex,
                                                     const Filtration_value& filtration) {
    Siblings * curr_sib = &root_;
    std::pair<Dictionary_it, bool> res_insert;
    auto vi = simplex.begin();

    for (; vi != std::prev(simplex.end()); ++vi) {
      GUDHI_CHECK(*vi != null_vertex(), "cannot use the dummy null_vertex() as a real vertex");
      res_insert = insert_node_<false, true, false>(curr_sib, *vi, filtration);
      curr_sib = res_insert.first->second.children();
    }

    GUDHI_CHECK(*vi != null_vertex(), "cannot use the dummy null_vertex() as a real vertex");
    res_insert = insert_node_<true, false, true>(curr_sib, *vi, filtration);
    if (res_insert.second){
      int dim = static_cast<int>(boost::size(simplex)) - 1;
      if (dim > dimension_) {
        // Update dimension if needed
        dimension_ = dim;
      }
    }
    return res_insert;
  }